

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O0

BOOL anon_unknown.dwarf_181b3::selector_types_equal(char *t1,char *t2)

{
  bool bVar1;
  char *local_20;
  char *t2_local;
  char *t1_local;
  
  if ((t1 == (char *)0x0) || (local_20 = t2, t2_local = t1, t2 == (char *)0x0)) {
    return t1 == t2;
  }
  while( true ) {
    bVar1 = false;
    if (*t2_local != '\0') {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    t2_local = skip_irrelevant_type_info(t2_local);
    local_20 = skip_irrelevant_type_info(local_20);
    if ((*t2_local == '*') && (*local_20 != '*')) {
      if ((*local_20 != '^') || ((local_20[1] != 'C' && (local_20[1] != 'c')))) {
        return '\0';
      }
      local_20 = local_20 + 1;
    }
    else if ((*local_20 == '*') && (*t2_local != '*')) {
      if ((*t2_local != '^') || ((t2_local[1] != 'C' && (t2_local[1] != 'c')))) {
        return '\0';
      }
      t2_local = t2_local + 1;
    }
    else if (*t2_local != *local_20) {
      return '\0';
    }
    if (*t2_local != '\0') {
      t2_local = t2_local + 1;
    }
    if (*local_20 != '\0') {
      local_20 = local_20 + 1;
    }
  }
  return '\x01';
}

Assistant:

static BOOL selector_types_equal(const char *t1, const char *t2)
{
	if (t1 == nullptr || t2 == nullptr) { return t1 == t2; }

	while (('\0' != *t1) && ('\0' != *t2))
	{
		t1 = skip_irrelevant_type_info(t1);
		t2 = skip_irrelevant_type_info(t2);
		// This is a really ugly hack.  For some stupid reason, the people
		// designing Objective-C type encodings decided to allow * as a
		// shorthand for char*, because strings are 'special'.  Unfortunately,
		// FSF GCC generates "*" for @encode(BOOL*), while Clang and Apple GCC
		// generate "^c" or "^C" (depending on whether BOOL is declared
		// unsigned).  
		//
		// The correct fix is to remove * completely from type encodings, but
		// unfortunately my time machine is broken so I can't travel to 1986
		// and apply a cluebat to those responsible.
		if ((*t1 == '*') && (*t2 != '*'))
		{
			if (*t2 == '^' && (((*(t2+1) == 'C') || (*(t2+1) == 'c'))))
			{
				t2++;
			}
			else
			{
				return NO;
			}
		}
		else if ((*t2 == '*') && (*t1 != '*'))
		{
			if (*t1 == '^' && (((*(t1+1) == 'C') || (*(t1+1) == 'c'))))
			{
				t1++;
			}
			else
			{
				return NO;
			}
		}
		else if (*t1 != *t2)
		{
			return NO;
		}

		if ('\0' != *t1) { t1++; }
		if ('\0' != *t2) { t2++; }
	}
	return YES;
}